

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O2

IterateResult __thiscall
dit::anon_unknown_0::SeedBuilderTest<tcu::Vector<int,_3>_>::iterate
          (SeedBuilderTest<tcu::Vector<int,_3>_> *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  MessageBuilder *this_00;
  char *description;
  bool bVar3;
  SeedBuilder builder;
  MessageBuilder local_1a0;
  
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::SeedBuilder::SeedBuilder(&builder);
  tcu::operator<<(&builder,&this->m_value);
  poVar1 = &local_1a0.m_str;
  local_1a0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Value: ");
  tcu::operator<<((ostream *)poVar1,&this->m_value);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1a0.m_str;
  local_1a0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Expected seed: ");
  this_00 = tcu::MessageBuilder::operator<<(&local_1a0,&this->m_seed);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1a0.m_str;
  local_1a0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Got seed: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  bVar3 = builder.m_hash != this->m_seed;
  if (bVar3) {
    description = "Got invalid seed";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)bVar3,description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log		= m_testCtx.getLog();
		tcu::SeedBuilder	builder;

		builder << m_value;

		log << TestLog::Message << "Value: " << m_value << TestLog::EndMessage;
		log << TestLog::Message << "Expected seed: " << m_seed << TestLog::EndMessage;
		log << TestLog::Message << "Got seed: " << builder.get() << TestLog::EndMessage;

		if (builder.get() != m_seed)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid seed");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}